

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::ExplicitProducer::
~ExplicitProducer(ExplicitProducer *this)

{
  long lVar1;
  Block *pBVar2;
  void *pvVar3;
  bool bVar4;
  ProducerBase *in_RDI;
  BlockIndexHeader *prev;
  BlockIndexHeader *header;
  Block *nextBlock;
  Block *block_1;
  size_t lastValidIndex;
  size_t i_1;
  Block *block;
  size_t i;
  Block *halfDequeuedBlock;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  ulong local_120;
  void *local_c0;
  Block *local_b0;
  ulong local_a0;
  Block *local_98;
  ulong local_90;
  Block *local_88;
  
  in_RDI->_vptr_ProducerBase = (_func_int **)&PTR__ExplicitProducer_002595f0;
  if (in_RDI->tailBlock != (Block *)0x0) {
    local_88 = (Block *)0x0;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if (((in_RDI->headIndex).super___atomic_base<unsigned_long>._M_i & 0x1f) != 0) {
      local_90 = (long)in_RDI[1].super_ConcurrentQueueProducerTypelessBase.token -
                 (long)in_RDI[1].super_ConcurrentQueueProducerTypelessBase.next &
                 *(long *)&in_RDI[1].super_ConcurrentQueueProducerTypelessBase.inactive - 1U;
      while( true ) {
        lVar1 = *(long *)(in_RDI[1].tailIndex.super___atomic_base<unsigned_long>._M_i +
                         local_90 * 0x10);
        std::operator&(memory_order_relaxed,__memory_order_mask);
        bVar4 = details::circular_less_than<unsigned_long>
                          (lVar1 + 0x20,(in_RDI->headIndex).super___atomic_base<unsigned_long>._M_i)
        ;
        if (!bVar4) break;
        local_90 = local_90 + 1 &
                   *(long *)&in_RDI[1].super_ConcurrentQueueProducerTypelessBase.inactive - 1U;
      }
      local_88 = *(Block **)
                  (in_RDI[1].tailIndex.super___atomic_base<unsigned_long>._M_i + local_90 * 0x10 + 8
                  );
    }
    local_98 = in_RDI->tailBlock;
    do {
      local_98 = local_98->next;
      bVar4 = ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::Block::
              is_empty<(moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
                        ((Block *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if (!bVar4) {
        local_a0 = 0;
        if (local_98 == local_88) {
          std::operator&(memory_order_relaxed,__memory_order_mask);
          local_a0 = (in_RDI->headIndex).super___atomic_base<unsigned_long>._M_i & 0x1f;
        }
        std::operator&(memory_order_relaxed,__memory_order_mask);
        if (((in_RDI->tailIndex).super___atomic_base<unsigned_long>._M_i & 0x1f) == 0) {
          local_120 = 0x20;
        }
        else {
          in_stack_fffffffffffffed0 =
               (ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits> *)
               &in_RDI->tailIndex;
          std::operator&(memory_order_relaxed,__memory_order_mask);
          in_stack_fffffffffffffedc = 0;
          local_120 = (ulong)(in_stack_fffffffffffffed0->producerListTail)._M_b._M_p & 0x1f;
        }
        while( true ) {
          bVar4 = false;
          if (local_a0 != 0x20) {
            in_stack_fffffffffffffece = local_98 != in_RDI->tailBlock || local_a0 != local_120;
            bVar4 = (bool)in_stack_fffffffffffffece;
          }
          if (!bVar4) break;
          Block::operator[](local_98,local_a0);
          CSP_Event::~CSP_Event((CSP_Event *)0x1248c5);
          local_a0 = local_a0 + 1;
        }
        in_stack_fffffffffffffecf = 0;
      }
    } while (local_98 != in_RDI->tailBlock);
  }
  if (in_RDI->tailBlock != (Block *)0x0) {
    local_b0 = in_RDI->tailBlock;
    do {
      pBVar2 = local_b0->next;
      if ((local_b0->dynamicallyAllocated & 1U) == 0) {
        add_block_to_free_list
                  (in_stack_fffffffffffffed0,
                   (Block *)CONCAT17(in_stack_fffffffffffffecf,
                                     CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)))
        ;
      }
      else {
        ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::
        destroy<moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::Block>
                  ((Block *)0x12493b);
      }
      local_b0 = pBVar2;
    } while (pBVar2 != in_RDI->tailBlock);
  }
  local_c0 = (void *)in_RDI[1].headIndex.super___atomic_base<unsigned_long>._M_i;
  while (local_c0 != (void *)0x0) {
    pvVar3 = *(void **)((long)local_c0 + 0x18);
    ConcurrentQueueDefaultTraits::free(local_c0);
    local_c0 = pvVar3;
  }
  ProducerBase::~ProducerBase(in_RDI);
  return;
}

Assistant:

~ExplicitProducer()
        {
            // Destruct any elements not yet dequeued.
            // Since we're in the destructor, we can assume all elements
            // are either completely dequeued or completely not (no halfways).
            if (this->tailBlock != nullptr) {       // Note this means there must be a block index too
                // First find the block that's partially dequeued, if any
                Block* halfDequeuedBlock = nullptr;
                if ((this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) != 0) {
                    // The head's not on a block boundary, meaning a block somewhere is partially dequeued
                    // (or the head block is the tail block and was fully dequeued, but the head/tail are still not on a boundary)
                    size_t i = (pr_blockIndexFront - pr_blockIndexSlotsUsed) & (pr_blockIndexSize - 1);
                    while (details::circular_less_than<index_t>(pr_blockIndexEntries[i].base + BLOCK_SIZE, this->headIndex.load(std::memory_order_relaxed))) {
                        i = (i + 1) & (pr_blockIndexSize - 1);
                    }
                    assert(details::circular_less_than<index_t>(pr_blockIndexEntries[i].base, this->headIndex.load(std::memory_order_relaxed)));
                    halfDequeuedBlock = pr_blockIndexEntries[i].block;
                }
                
                // Start at the head block (note the first line in the loop gives us the head from the tail on the first iteration)
                auto block = this->tailBlock;
                do {
                    block = block->next;
                    if (block->ConcurrentQueue::Block::template is_empty<explicit_context>()) {
                        continue;
                    }
                    
                    size_t i = 0;   // Offset into block
                    if (block == halfDequeuedBlock) {
                        i = static_cast<size_t>(this->headIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
                    }
                    
                    // Walk through all the items in the block; if this is the tail block, we need to stop when we reach the tail index
                    auto lastValidIndex = (this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1)) == 0 ? BLOCK_SIZE : static_cast<size_t>(this->tailIndex.load(std::memory_order_relaxed) & static_cast<index_t>(BLOCK_SIZE - 1));
                    while (i != BLOCK_SIZE && (block != this->tailBlock || i != lastValidIndex)) {
                        (*block)[i++]->~T();
                    }
                } while (block != this->tailBlock);
            }
            
            // Destroy all blocks that we own
            if (this->tailBlock != nullptr) {
                auto block = this->tailBlock;
                do {
                    auto nextBlock = block->next;
                    if (block->dynamicallyAllocated) {
                        destroy(block);
                    }
                    else {
                        this->parent->add_block_to_free_list(block);
                    }
                    block = nextBlock;
                } while (block != this->tailBlock);
            }
            
            // Destroy the block indices
            auto header = static_cast<BlockIndexHeader*>(pr_blockIndexRaw);
            while (header != nullptr) {
                auto prev = static_cast<BlockIndexHeader*>(header->prev);
                header->~BlockIndexHeader();
                (Traits::free)(header);
                header = prev;
            }
        }